

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.cpp
# Opt level: O1

void jbcoin::openssl::serialize_ec_point(ec_point *point,uint8_t *ptr)

{
  int iVar1;
  EC_KEY *eckey;
  ec_key key;
  ec_key local_20;
  uint8_t *local_18;
  
  local_18 = ptr;
  eckey = EC_KEY_new_by_curve_name(0x2ca);
  if (eckey == (EC_KEY *)0x0) {
    Throw<std::runtime_error,char_const(&)[34]>((char (*) [34])"EC_KEY_new_by_curve_name() failed");
  }
  EC_KEY_set_conv_form(eckey,POINT_CONVERSION_COMPRESSED);
  local_20.ptr = (pointer_t)eckey;
  iVar1 = EC_KEY_set_public_key(eckey,(EC_POINT *)point->ptr);
  if (0 < iVar1) {
    iVar1 = i2o_ECPublicKey((EC_KEY *)local_20.ptr,&local_18);
    if (iVar1 < 0x22) {
      ec_key::~ec_key(&local_20);
      return;
    }
    __assert_fail("size <= 33",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/crypto/impl/openssl.cpp"
                  ,0x7a,"void jbcoin::openssl::serialize_ec_point(const ec_point &, std::uint8_t *)"
                 );
  }
  Throw<std::runtime_error,char_const(&)[31]>((char (*) [31])"EC_KEY_set_public_key() failed");
}

Assistant:

void serialize_ec_point (ec_point const& point, std::uint8_t* ptr)
{
    ec_key key = ec_key_new_secp256k1_compressed();
    if (EC_KEY_set_public_key((EC_KEY*) key.get(), point.get()) <= 0)
        Throw<std::runtime_error> ("EC_KEY_set_public_key() failed");

    int const size = i2o_ECPublicKey ((EC_KEY*) key.get(), &ptr);

    assert (size <= 33);
    (void) size;
}